

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5NewTransaction(Fts5FullTable *pTab)

{
  int iVar1;
  Fts5Cursor *pFVar2;
  Fts5Index *p;
  Fts5Cursor **ppFVar3;
  i64 iVar4;
  
  ppFVar3 = &pTab->pGlobal->pCsr;
  do {
    pFVar2 = *ppFVar3;
    if (pFVar2 == (Fts5Cursor *)0x0) {
      p = pTab->pStorage->pIndex;
      iVar4 = fts5IndexDataVersion(p);
      if (iVar4 != p->iStructVersion) {
        fts5StructureInvalidate(p);
      }
      iVar1 = p->rc;
      p->rc = 0;
      return iVar1;
    }
    ppFVar3 = &pFVar2->pNext;
  } while ((Fts5FullTable *)(pFVar2->base).pVtab != pTab);
  return 0;
}

Assistant:

static int fts5NewTransaction(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->base.pVtab==(sqlite3_vtab*)pTab ) return SQLITE_OK;
  }
  return sqlite3Fts5StorageReset(pTab->pStorage);
}